

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ur_kin.cpp
# Opt level: O0

bool ComputeIk(IkReal *eetrans,IkReal *eerot,IkReal *pfree,IkSolutionListBase<double> *solutions)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  int local_290;
  allocator<ikfast::IkSingleDOFSolutionBase<double>_> local_289;
  int j;
  vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
  vinfos;
  int i;
  allocator<int> local_259;
  undefined1 local_258 [8];
  vector<int,_std::allocator<int>_> vfree;
  int num_sols;
  double T [16];
  double q_sols [48];
  int n;
  IkSolutionListBase<double> *solutions_local;
  IkReal *pfree_local;
  IkReal *eerot_local;
  IkReal *eetrans_local;
  
  if (pfree == (IkReal *)0x0) {
    eetrans_local._7_1_ = false;
  }
  else {
    iVar2 = GetNumJoints();
    to_mat44((double *)&stack0xfffffffffffffdc8,eetrans,eerot);
    vfree.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         ur_kinematics::inverse((double *)&stack0xfffffffffffffdc8,T + 0xf,*pfree);
    std::allocator<int>::allocator(&local_259);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_258,0,&local_259);
    std::allocator<int>::~allocator(&local_259);
    for (vinfos.
         super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (int)vinfos.
             super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage <
        vfree.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_;
        vinfos.
        super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)vinfos.
                  super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>::allocator(&local_289);
      std::
      vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
      ::vector((vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                *)&j,(long)iVar2,&local_289);
      std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>::~allocator(&local_289);
      for (local_290 = 0; local_290 < iVar2; local_290 = local_290 + 1) {
        dVar1 = T[(long)((int)vinfos.
                              super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage * iVar2 + local_290
                        ) + 0xf];
        pvVar3 = std::
                 vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                 ::operator[]((vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                               *)&j,(long)local_290);
        pvVar3->foffset = dVar1;
      }
      (*solutions->_vptr_IkSolutionListBase[2])(solutions,&j,local_258);
      std::
      vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
      ::~vector((vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                 *)&j);
    }
    eetrans_local._7_1_ =
         0 < vfree.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_258);
  }
  return eetrans_local._7_1_;
}

Assistant:

IKFAST_API bool ComputeIk(const IkReal* eetrans, const IkReal* eerot, const IkReal* pfree, IkSolutionListBase<IkReal>& solutions) {
  if(!pfree) return false;

  int n = GetNumJoints();
  double q_sols[8*6];
  double T[16];

  to_mat44(T, eetrans, eerot);

  int num_sols = ur_kinematics::inverse(T, q_sols,pfree[0]);

  std::vector<int> vfree(0);

  for (int i=0; i < num_sols; ++i){
    std::vector<IkSingleDOFSolutionBase<IkReal> > vinfos(n);
    for (int j=0; j < n; ++j) vinfos[j].foffset = q_sols[i*n+j];
    solutions.AddSolution(vinfos,vfree);
  }
  return num_sols > 0;
}